

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilBridge.c
# Opt level: O0

int aigerNumSize(uint x)

{
  undefined4 local_10;
  undefined4 local_c;
  int sz;
  uint x_local;
  
  local_10 = 1;
  for (local_c = x; (local_c & 0xffffff80) != 0; local_c = local_c >> 7) {
    local_10 = local_10 + 1;
  }
  return local_10;
}

Assistant:

static int aigerNumSize( unsigned x )
{
    int sz = 1;
    while (x & ~0x7f)
    {
        sz++;
        x >>= 7;
    }
    return sz;
}